

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O3

bool FileUtil::readDataLocally
               (string *data_path,vector<Rating,_std::allocator<Rating>_> *ratings,int min_row_index
               ,int max_row_index,int total_rating_num,int row_num)

{
  pointer pRVar1;
  void *pvVar2;
  long *plVar3;
  void *pvVar4;
  void *pvVar5;
  ostream *poVar6;
  int iVar7;
  ulong uVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  value_type_conflict1 *pvVar14;
  int iVar15;
  bool bVar16;
  ifstream data_file;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,(string *)data_path,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"cannot open ",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(data_path->_M_dataplus)._M_p,
                        data_path->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(1);
  }
  std::istream::seekg((long)local_238,min_row_index * 8);
  iVar10 = max_row_index - min_row_index;
  uVar8 = 0xffffffffffffffff;
  if (-1 < iVar10) {
    uVar8 = (long)(iVar10 * 8) * 4;
  }
  pvVar2 = operator_new__(uVar8);
  plVar3 = (long *)std::istream::read((char *)local_238,(long)pvVar2);
  if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    std::istream::seekg((long)local_238,total_rating_num << 3);
    uVar8 = 0xffffffffffffffff;
    if (-2 < row_num) {
      uVar8 = (long)(row_num * 4 + 4) * 4;
    }
    pvVar4 = operator_new__(uVar8);
    plVar3 = (long *)std::istream::read((char *)local_238,(long)pvVar4);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
      std::istream::seekg((long)local_238,min_row_index * 4);
      uVar8 = 0xffffffffffffffff;
      if (-1 < iVar10) {
        uVar8 = (long)(iVar10 * 4) * 4;
      }
      pvVar5 = operator_new__(uVar8);
      plVar3 = (long *)std::istream::read((char *)local_238,(long)pvVar5);
      bVar16 = (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0;
      if (bVar16) {
        std::vector<Rating,_std::allocator<Rating>_>::resize(ratings,(long)iVar10);
        if (0 < row_num) {
          uVar8 = 1;
          pRVar1 = (ratings->super__Vector_base<Rating,_std::allocator<Rating>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar7 = 0;
          do {
            iVar11 = *(int *)((long)pvVar4 + uVar8 * 4);
            if (min_row_index <= iVar11) {
              iVar15 = *(int *)((long)pvVar4 + uVar8 * 4 + -4);
              iVar12 = min_row_index;
              if ((min_row_index <= iVar15) && (iVar12 = iVar15, max_row_index <= iVar15)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Logical error!",0xe);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                bVar16 = false;
                goto LAB_00123616;
              }
              iVar11 = iVar11 - iVar15;
              if (max_row_index - iVar15 <= iVar11) {
                iVar11 = max_row_index - iVar15;
              }
              if (0 < iVar11) {
                lVar13 = (long)iVar7;
                iVar15 = 0;
                pvVar14 = &pRVar1[lVar13].score;
                do {
                  lVar13 = lVar13 + 1;
                  ((Rating *)(pvVar14 + -2))->global_id = iVar12;
                  *(int *)((long)pvVar14 + -0xc) = (int)uVar8 + -1;
                  *(int *)(pvVar14 + -1) = *(int *)((long)pvVar5 + lVar13 * 4 + -4);
                  *pvVar14 = *(value_type_conflict1 *)((long)pvVar2 + lVar13 * 8 + -8);
                  if (iVar10 <= lVar13) goto LAB_001235ec;
                  pvVar14 = pvVar14 + 3;
                  iVar15 = iVar15 + -1;
                  iVar12 = iVar12 + 1;
                } while (-iVar11 != iVar15);
                iVar7 = iVar7 - iVar15;
              }
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != row_num + 1);
        }
LAB_001235ec:
        std::ifstream::close();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in reading col index from file!",0x25);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
      }
      operator_delete__(pvVar2);
      pvVar9 = pvVar4;
      pvVar2 = pvVar5;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error in reading row index from file!",0x25);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      bVar16 = false;
      pvVar9 = pvVar2;
      pvVar2 = pvVar4;
    }
    operator_delete__(pvVar9);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error in reading rating values from file!",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    bVar16 = false;
  }
  operator_delete__(pvVar2);
LAB_00123616:
  std::ifstream::~ifstream(local_238);
  return bVar16;
}

Assistant:

bool readDataLocally(string data_path, vector<Rating> &ratings, const int min_row_index,
                         const int max_row_index, const int total_rating_num, const int row_num) {
        ifstream data_file(data_path);
        if(!data_file.good()){
            cerr << "cannot open " << data_path << endl;
            exit(1);
        }

        long long begin_skip = min_row_index * size_of_double;

        // scores
        data_file.seekg(begin_skip, std::ios_base::cur);

        long long size = (max_row_index - min_row_index) * size_of_double;
        int *score_rows = new int[size];
        if (!data_file.read(reinterpret_cast<char *>(score_rows), size)) {
            cerr << "Error in reading rating values from file!" << endl;
            delete[] score_rows;
            return false;
        }

        double *score_ptr = reinterpret_cast<double *>(score_rows);

        // row_index
        begin_skip = total_rating_num * size_of_double;
        data_file.seekg(begin_skip, std::ios_base::beg);
        long long size2 = size_of_int * (row_num + 1);
        int *row_nums = new int[size2];
        if (!data_file.read(reinterpret_cast<char *>(row_nums), size2)) {
            cerr << "Error in reading row index from file!" << endl;
            delete[] score_rows;
            delete[] row_nums;
            return false;
        }

        // col_index
        begin_skip = min_row_index * size_of_int;
        data_file.seekg(begin_skip, std::ios_base::cur);

        long long size3 = size_of_int * (max_row_index - min_row_index);

        int *col_indices = new int[size3];
        if (!data_file.read(reinterpret_cast<char *>(col_indices), size3)) {
            cerr << "Error in reading col index from file!" << endl;
            delete[] score_rows;
            delete[] row_nums;
            delete[] col_indices;
            return false;
        }

        // format data
        ratings.resize(max_row_index - min_row_index);
        int index = 0;
        int global_id_start = 0;
        int rating_num = 0;
        bool finish = false;
        for (int row_index = 1; row_index < row_num + 1; row_index++) {

            // accumulation includes row of row_index = row_nums[row_index];
            if (row_nums[row_index] < min_row_index) {
                continue;
            } else if (row_nums[row_index - 1] < min_row_index && row_nums[row_index] >= min_row_index) {
                global_id_start = min_row_index;
                rating_num = std::min(max_row_index - row_nums[row_index - 1],
                                      row_nums[row_index] - row_nums[row_index - 1]);
            } else if (row_nums[row_index - 1] >= min_row_index && row_nums[row_index - 1] < max_row_index) {
                global_id_start = row_nums[row_index - 1];
                rating_num = std::min(max_row_index - row_nums[row_index - 1],
                                      row_nums[row_index] - row_nums[row_index - 1]);
            } else {
                cerr << "Logical error!" << endl;
                return false;
            }

            for (int offset = 0; offset < rating_num; offset++) {
                ratings[index].global_id = global_id_start + offset;
                ratings[index].user_id = row_index - 1;
                ratings[index].item_id = col_indices[index];
                ratings[index].score = score_ptr[index];

                index++;
                if (index >= max_row_index - min_row_index) {
                    finish = true;
                    break;
                }
            }

            if (finish) {
                break;
            }
        }

        data_file.close();

        delete[] score_rows;
        delete[] row_nums;
        delete[] col_indices;

        return true;
    }